

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter.c
# Opt level: O0

void sys_init_fdpoll(void)

{
  t_fdpoll *ptVar1;
  _binbuf *p_Var2;
  
  if ((pd_maininstance.pd_inter)->i_fdpoll == (t_fdpoll *)0x0) {
    ptVar1 = (t_fdpoll *)getbytes(0);
    (pd_maininstance.pd_inter)->i_fdpoll = ptVar1;
    (pd_maininstance.pd_inter)->i_nfdpoll = 0;
    p_Var2 = binbuf_new();
    (pd_maininstance.pd_inter)->i_inbinbuf = p_Var2;
  }
  return;
}

Assistant:

void sys_init_fdpoll(void)
{
    if (INTER->i_fdpoll)
        return;
    /* create an empty FD poll list */
    INTER->i_fdpoll = (t_fdpoll *)t_getbytes(0);
    INTER->i_nfdpoll = 0;
    INTER->i_inbinbuf = binbuf_new();
}